

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutApi::MidiOutApi(MidiOutApi *this)

{
  MidiOutApi *this_local;
  
  MidiApi::MidiApi(&this->super_MidiApi);
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiOutApi_00126b50;
  return;
}

Assistant:

MidiOutApi :: MidiOutApi( void )
  : MidiApi()
{
}